

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_FormatDec_Test::TestBody(FormatterTest_FormatDec_Test *this)

{
  int *in_RCX;
  int *piVar1;
  uint *args;
  char *pcVar2;
  char (*pacVar3) [256];
  char (*pacVar4) [256];
  char *pcVar5;
  AssertionResult gtest_ar_7;
  AssertHelper local_140;
  AssertionResult gtest_ar;
  char buffer [256];
  
  gtest_ar_7.success_ = false;
  gtest_ar_7._1_3_ = 0;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)0x1f0c7c,&gtest_ar_7.success_,in_RCX);
  piVar1 = (int *)0x1fa90d;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0\"","format(\"{0}\", 0)",(char (*) [2])0x1fa90d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0x555;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x555,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)0x1f0c7c,&gtest_ar_7.success_,piVar1);
  piVar1 = (int *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0}\", 42)",(char (*) [3])0x1f1bef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0x556;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x556,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0;
  fmt::v5::format<char[6],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)"{0:d}",&gtest_ar_7.success_,piVar1);
  args = (uint *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0:d}\", 42)",(char (*) [3])0x1f1bef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args = (uint *)0x557;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x557,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0;
  fmt::v5::format<char[4],unsigned_int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)0x1f0c7c,&gtest_ar_7.success_,args);
  piVar1 = (int *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0}\", 42u)",(char (*) [3])0x1f1bef,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0x558;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x558,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0xffffff;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)0x1f0c7c,&gtest_ar_7.success_,piVar1);
  piVar1 = (int *)0x1ea562;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42\"","format(\"{0}\", -42)",(char (*) [4])0x1ea562,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar1 = (int *)0x559;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x559,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0x30;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)0x1f0c7c,&gtest_ar_7.success_,piVar1);
  pcVar2 = "12345";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"12345\"","format(\"{0}\", 12345)",(char (*) [6])"12345",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x55a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x55a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0x109;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
             (v5 *)0x1f0c7c,&gtest_ar_7.success_,(int *)pcVar2);
  pcVar2 = "67890";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"67890\"","format(\"{0}\", 67890)",(char (*) [6])"67890",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)buffer);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar2 = (char *)0x55b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x55b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)buffer);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)buffer);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pacVar3 = &buffer;
  safe_sprintf<256ul>(pacVar3,"%d",0x80000000);
  local_140.data_._0_4_ = 0x80000000;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x1f0c7c,(char (*) [4])&local_140,(int *)pcVar2);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"buffer","format(\"{0}\", (-2147483647 -1))",pacVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar3 = (char (*) [256])0x55e;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x55e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  pacVar4 = &buffer;
  safe_sprintf<256ul>(pacVar4,"%d",0x7fffffff);
  local_140.data_._0_4_ = 0x7fffffff;
  fmt::v5::format<char[4],int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x1f0c7c,(char (*) [4])&local_140,(int *)pacVar3);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"buffer","format(\"{0}\", 2147483647)",pacVar4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar4 = (char (*) [256])0x560;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x560,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  pacVar3 = &buffer;
  safe_sprintf<256ul>(pacVar3,"%u",0xffffffffffffffff);
  local_140.data_._0_4_ = 0xffffffff;
  fmt::v5::format<char[4],unsigned_int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x1f0c7c,(char (*) [4])&local_140,(uint *)pacVar4);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"buffer","format(\"{0}\", (2147483647 *2U +1U))",pacVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar3 = (char (*) [256])0x562;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x562,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  pacVar4 = &buffer;
  safe_sprintf<256ul>(pacVar4,"%ld",0x8000000000000000);
  local_140.data_ = (AssertHelperData *)0x8000000000000000;
  fmt::v5::format<char[4],long>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x1f0c7c,(char (*) [4])&local_140,(long *)pacVar3);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"buffer","format(\"{0}\", (-9223372036854775807L -1L))",pacVar4
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar4 = (char (*) [256])0x564;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x564,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  pacVar3 = &buffer;
  safe_sprintf<256ul>(pacVar3,"%ld",0x7fffffffffffffff);
  local_140.data_ = (AssertHelperData *)0x7fffffffffffffff;
  fmt::v5::format<char[4],long>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x1f0c7c,(char (*) [4])&local_140,(long *)pacVar4);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"buffer","format(\"{0}\", 9223372036854775807L)",pacVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    pacVar3 = (char (*) [256])0x566;
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x566,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  safe_sprintf<256ul>(&buffer,"%lu",0xffffffffffffffff);
  local_140.data_ = (AssertHelperData *)0xffffffffffffffff;
  fmt::v5::format<char[4],unsigned_long>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (v5 *)0x1f0c7c,(char (*) [4])&local_140,(unsigned_long *)pacVar3);
  testing::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            ((internal *)&gtest_ar_7,"buffer","format(\"{0}\", (9223372036854775807L *2UL+1UL))",
             &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar)
  ;
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x568,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  return;
}

Assistant:

TEST(FormatterTest, FormatDec) {
  EXPECT_EQ("0", format("{0}", 0));
  EXPECT_EQ("42", format("{0}", 42));
  EXPECT_EQ("42", format("{0:d}", 42));
  EXPECT_EQ("42", format("{0}", 42u));
  EXPECT_EQ("-42", format("{0}", -42));
  EXPECT_EQ("12345", format("{0}", 12345));
  EXPECT_EQ("67890", format("{0}", 67890));
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%d", INT_MIN);
  EXPECT_EQ(buffer, format("{0}", INT_MIN));
  safe_sprintf(buffer, "%d", INT_MAX);
  EXPECT_EQ(buffer, format("{0}", INT_MAX));
  safe_sprintf(buffer, "%u", UINT_MAX);
  EXPECT_EQ(buffer, format("{0}", UINT_MAX));
  safe_sprintf(buffer, "%ld", 0 - static_cast<unsigned long>(LONG_MIN));
  EXPECT_EQ(buffer, format("{0}", LONG_MIN));
  safe_sprintf(buffer, "%ld", LONG_MAX);
  EXPECT_EQ(buffer, format("{0}", LONG_MAX));
  safe_sprintf(buffer, "%lu", ULONG_MAX);
  EXPECT_EQ(buffer, format("{0}", ULONG_MAX));
}